

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::Team::~Team(Team *this)

{
  Team *this_local;
  
  field<discordpp::Snowflake>::~field(&this->owner_user_id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->name);
  field<std::vector<discordpp::TeamMember,_std::allocator<discordpp::TeamMember>_>_>::~field
            (&this->members);
  field<discordpp::Snowflake>::~field(&this->id);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~nullable_field(&this->icon);
  return;
}

Assistant:

Team(
        nullable_field<std::string> icon = uninitialized,
        field<Snowflake> id = uninitialized,
        field<std::vector<TeamMember> > members = uninitialized,
        field<std::string> name = uninitialized,
        field<Snowflake> owner_user_id = uninitialized
    ):
        icon(icon),
        id(id),
        members(members),
        name(name),
        owner_user_id(owner_user_id)
    {}